

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

Constraint * __thiscall
slang::ast::ConstraintBlockSymbol::getConstraints(ConstraintBlockSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  Symbol *pSVar3;
  Scope *scope;
  undefined1 auVar4 [16];
  byte bVar5;
  int iVar6;
  DiagCode DVar7;
  SourceLocation SVar8;
  Diagnostic *pDVar9;
  Diagnostic *this_00;
  undefined4 extraout_var;
  InvalidConstraint *pIVar10;
  socklen_t __len;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  DiagCode code;
  long lVar11;
  bool bVar12;
  SourceRange sourceRange;
  bitmask<slang::ast::ConstraintBlockFlags> declFlags;
  ASTContext context;
  bitmask<slang::ast::ConstraintBlockFlags> local_89;
  Token local_88;
  tuple<const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*> local_78;
  Scope *local_60;
  char local_58 [8];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  if (this->constraint != (Constraint *)0x0) {
    return this->constraint;
  }
  pSVar1 = (this->super_Symbol).parentScope;
  pSVar2 = (this->super_Symbol).originatingSyntax;
  local_60 = &this->super_Scope;
  __len = 0xffffffff;
  local_58[0] = -1;
  local_58[1] = -1;
  local_58[2] = -1;
  local_58[3] = -1;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  if (pSVar2->kind == ConstraintPrototype) {
    pSVar3 = pSVar1->thisSym;
    scope = pSVar3->parentScope;
    Compilation::findOutOfBlockDecl
              (&local_78,scope->compilation,scope,pSVar3->name,(this->super_Symbol).name);
    if (((local_78.
          super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
          .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl ==
          (SyntaxNode *)0x0) ||
        ((local_78.
          super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
          .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl)->kind !=
         ConstraintDeclaration)) || ((this->super_Symbol).name._M_len == 0)) {
      bVar5 = (this->flags).m_bits;
      if (((bVar5 & 2) == 0) && ((this->super_Symbol).name._M_len != 0)) {
        DVar7.subsystem = Declarations;
        DVar7.code = 0xf5;
        code.subsystem = Declarations;
        code.code = 0x8b;
        if ((bVar5 & 0x10) == 0) {
          code = DVar7;
        }
        pDVar9 = Scope::addDiag(scope,code,(this->super_Symbol).location);
        Diagnostic::operator<<(pDVar9,(this->super_Symbol).name);
      }
    }
    else {
      *(bool *)local_78.
               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
               .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
               super__Tuple_impl<2UL,_bool_*>.super__Head_base<2UL,_bool_*,_false>._M_head_impl =
           true;
      if (((this->flags).m_bits & 2) == 0) {
        this->outOfBlockIndex =
             local_78.
             super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
             .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
             super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl;
        if (local_78.
            super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
            .super__Tuple_impl<1UL,_slang::ast::SymbolIndex,_bool_*>.
            super__Head_base<1UL,_slang::ast::SymbolIndex,_false>._M_head_impl <=
            pSVar3->indexInScope) {
          local_88 = slang::syntax::SyntaxNode::getLastToken
                               (local_78.
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                                _M_head_impl[8].previewNode);
          SVar8 = parsing::Token::location(&local_88);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0x6e0006,SVar8);
          this_00 = Diagnostic::operator<<(pDVar9,(this->super_Symbol).name);
          Diagnostic::operator<<(this_00,pSVar3->name);
          Diagnostic::addNote(pDVar9,(DiagCode)0x50001,pSVar3->location);
        }
        if (local_78.
            super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
            .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl[5].parent
            == (SyntaxNode *)0x0) {
          bVar5 = 0;
        }
        else {
          lVar11 = 0;
          do {
            bVar5 = 0;
            if (*(short *)(*(long *)(local_78.
                                     super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                     .
                                     super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>
                                     ._M_head_impl + 5) + lVar11) == 0x11c) {
              bVar5 = 1;
              break;
            }
            bVar12 = (long)local_78.
                           super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                           .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                           _M_head_impl[5].parent * 0x10 + -0x10 != lVar11;
            lVar11 = lVar11 + 0x10;
          } while (bVar12);
        }
        if (((this->flags).m_bits & 4) >> 2 != bVar5) {
          local_88 = slang::syntax::SyntaxNode::getFirstToken
                               (local_78.
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                                _M_head_impl);
          SVar8 = parsing::Token::location(&local_88);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0x790006,SVar8);
          Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(this->super_Symbol).location);
        }
        local_89.m_bits = 0;
        addSpecifierFlags((SyntaxList<slang::syntax::ClassSpecifierSyntax> *)
                          &local_78.
                           super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                           .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                           _M_head_impl[6].parent,&local_89);
        __len = extraout_EDX;
        if (local_89.m_bits != ((this->flags).m_bits & 0xe0)) {
          local_88 = slang::syntax::SyntaxNode::getLastToken
                               (local_78.
                                super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                                .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                                _M_head_impl[8].previewNode);
          SVar8 = parsing::Token::location(&local_88);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0x780006,SVar8);
          Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(this->super_Symbol).location);
          __len = extraout_EDX_00;
        }
        iVar6 = (int)*(undefined8 *)
                      (local_78.
                       super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                       .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl
                      + 9);
        goto LAB_0023c73c;
      }
      sourceRange = slang::syntax::SyntaxNode::sourceRange
                              (local_78.
                               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_slang::ast::SymbolIndex,_bool_*>
                               .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>.
                               _M_head_impl[8].previewNode);
      pDVar9 = Scope::addDiag(scope,(DiagCode)0xd0006,sourceRange);
      Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(this->super_Symbol).location);
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_88.info;
    local_88 = (Token)(auVar4 << 0x40);
    pIVar10 = BumpAllocator::emplace<slang::ast::InvalidConstraint,decltype(nullptr)>
                        (&pSVar1->compilation->super_BumpAllocator,(void **)&local_88);
  }
  else {
    iVar6 = (int)*(undefined8 *)(pSVar2 + 9);
LAB_0023c73c:
    iVar6 = Constraint::bind(iVar6,(sockaddr *)&local_60,__len);
    pIVar10 = (InvalidConstraint *)CONCAT44(extraout_var,iVar6);
  }
  this->constraint = &pIVar10->super_Constraint;
  return &pIVar10->super_Constraint;
}

Assistant:

const Constraint& ConstraintBlockSymbol::getConstraints() const {
    if (constraint)
        return *constraint;

    auto syntax = getSyntax();
    auto scope = getParentScope();
    SLANG_ASSERT(syntax && scope);
    ASTContext context(*this, LookupLocation::max);

    if (syntax->kind == SyntaxKind::ConstraintPrototype) {
        // The out-of-block definition must be in our parent scope.
        auto& parentSym = scope->asSymbol();
        auto& outerScope = *parentSym.getParentScope();
        auto& comp = outerScope.getCompilation();

        auto [declSyntax, index, used] = comp.findOutOfBlockDecl(outerScope, parentSym.name, name);
        if (!declSyntax || declSyntax->kind != SyntaxKind::ConstraintDeclaration || name.empty()) {
            if (!flags.has(ConstraintBlockFlags::Pure) && !name.empty()) {
                DiagCode code = flags.has(ConstraintBlockFlags::ExplicitExtern)
                                    ? diag::NoMemberImplFound
                                    : diag::NoConstraintBody;
                outerScope.addDiag(code, location) << name;
            }
            constraint = scope->getCompilation().emplace<InvalidConstraint>(nullptr);
            return *constraint;
        }

        auto& cds = declSyntax->as<ConstraintDeclarationSyntax>();
        *used = true;

        if (flags.has(ConstraintBlockFlags::Pure)) {
            auto& diag = outerScope.addDiag(diag::BodyForPureConstraint, cds.name->sourceRange());
            diag.addNote(diag::NoteDeclarationHere, location);
            constraint = scope->getCompilation().emplace<InvalidConstraint>(nullptr);
            return *constraint;
        }

        // The method definition must be located after the class definition.
        outOfBlockIndex = index;
        if (index <= parentSym.getIndex()) {
            auto& diag = outerScope.addDiag(diag::MemberDefinitionBeforeClass,
                                            cds.name->getLastToken().location());
            diag << name << parentSym.name;
            diag.addNote(diag::NoteDeclarationHere, parentSym.location);
        }

        bool declStatic = false;
        for (auto qual : cds.qualifiers) {
            if (qual.kind == TokenKind::StaticKeyword) {
                declStatic = true;
                break;
            }
        }

        if (declStatic != flags.has(ConstraintBlockFlags::Static)) {
            auto& diag = outerScope.addDiag(diag::MismatchStaticConstraint,
                                            cds.getFirstToken().location());
            diag.addNote(diag::NoteDeclarationHere, location);
        }

        bitmask<ConstraintBlockFlags> declFlags;
        addSpecifierFlags(cds.specifiers, declFlags);

        if (declFlags != (flags & (ConstraintBlockFlags::Initial | ConstraintBlockFlags::Extends |
                                   ConstraintBlockFlags::Final))) {
            auto& diag = outerScope.addDiag(diag::MismatchConstraintSpecifiers,
                                            cds.name->getLastToken().location());
            diag.addNote(diag::NoteDeclarationHere, location);
        }

        constraint = &Constraint::bind(*cds.block, context);
        return *constraint;
    }

    constraint = &Constraint::bind(*syntax->as<ConstraintDeclarationSyntax>().block, context);
    return *constraint;
}